

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

void __thiscall libtorrent::torrent_info::torrent_info(torrent_info *this,torrent_info *param_1)

{
  sp_counted_base *psVar1;
  pointer pcVar2;
  long lVar3;
  time_t *ptVar4;
  time_t *ptVar5;
  byte bVar6;
  
  bVar6 = 0;
  file_storage::file_storage(&this->m_files,&param_1->m_files);
  aux::copy_ptr<const_libtorrent::file_storage>::copy_ptr
            (&this->m_orig_files,&param_1->m_orig_files);
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::vector(&(this->m_urls).
            super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ,&(param_1->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          );
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::vector
            (&this->m_web_seeds,&param_1->m_web_seeds);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector(&this->m_nodes,&param_1->m_nodes);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&this->m_similar_torrents,&param_1->m_similar_torrents);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            (&this->m_owned_similar_torrents,&param_1->m_owned_similar_torrents);
  ::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->m_collections,&param_1->m_collections);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_owned_collections,&param_1->m_owned_collections);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            (&(this->m_merkle_tree).
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             ,&(param_1->m_merkle_tree).
               super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            );
  ::std::
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&(this->m_piece_layers).
            super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           ,&(param_1->m_piece_layers).
             super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
          );
  (this->m_info_section).px = (param_1->m_info_section).px;
  psVar1 = (param_1->m_info_section).pn.pi_;
  (this->m_info_section).pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->use_count_ = psVar1->use_count_ + 1;
    UNLOCK();
  }
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  pcVar2 = (param_1->m_comment)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_comment,pcVar2,pcVar2 + (param_1->m_comment)._M_string_length);
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  pcVar2 = (param_1->m_created_by)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_created_by,pcVar2,pcVar2 + (param_1->m_created_by)._M_string_length)
  ;
  bdecode_node::bdecode_node(&this->m_info_dict,&param_1->m_info_dict);
  ptVar4 = &param_1->m_creation_date;
  ptVar5 = &this->m_creation_date;
  for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
    *ptVar5 = *ptVar4;
    ptVar4 = ptVar4 + (ulong)bVar6 * -2 + 1;
    ptVar5 = ptVar5 + (ulong)bVar6 * -2 + 1;
  }
  (this->m_flags).m_val = (param_1->m_flags).m_val;
  this->m_info_section_size = param_1->m_info_section_size;
  return;
}

Assistant:

bool torrent_info::resolve_duplicate_filenames(int const max_duplicate_filenames
		, error_code& ec)
	{
		INVARIANT_CHECK;

		std::unordered_set<std::uint32_t> files;

		std::string const empty_str;

		// insert all directories first, to make sure no files
		// are allowed to collied with them
		m_files.all_path_hashes(files);
		for (auto const i : m_files.file_range())
		{
			// as long as this file already exists
			// increase the counter
			std::uint32_t const h = m_files.file_path_hash(i, empty_str);
			if (!files.insert(h).second)
			{
				// This filename appears to already exist!
				// If this happens, just start over and do it the slow way,
				// comparing full file names and come up with new names
				return resolve_duplicate_filenames_slow(max_duplicate_filenames, ec);
			}
		}
		return true;
	}